

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O0

void bn_mul_low_normal(unsigned_long *r,unsigned_long *a,unsigned_long *b,int n)

{
  int in_ECX;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  int local_1c;
  ulong *local_18;
  ulong *local_8;
  
  bn_mul_words(in_RDI,in_RSI,in_ECX,*in_RDX);
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  while( true ) {
    if (local_1c + -1 < 1) {
      return;
    }
    bn_mul_add_words(local_8 + 1,in_RSI,local_1c + -1,local_18[1]);
    if (local_1c + -2 < 1) {
      return;
    }
    bn_mul_add_words(local_8 + 2,in_RSI,local_1c + -2,local_18[2]);
    if (local_1c + -3 < 1) {
      return;
    }
    bn_mul_add_words(local_8 + 3,in_RSI,local_1c + -3,local_18[3]);
    local_1c = local_1c + -4;
    if (local_1c < 1) break;
    bn_mul_add_words(local_8 + 4,in_RSI,local_1c,local_18[4]);
    local_8 = local_8 + 4;
    local_18 = local_18 + 4;
  }
  return;
}

Assistant:

void bn_mul_low_normal(BN_ULONG *r, BN_ULONG *a, BN_ULONG *b, int n)
{
    bn_mul_words(r, a, n, b[0]);

    for (;;) {
        if (--n <= 0)
            return;
        bn_mul_add_words(&(r[1]), a, n, b[1]);
        if (--n <= 0)
            return;
        bn_mul_add_words(&(r[2]), a, n, b[2]);
        if (--n <= 0)
            return;
        bn_mul_add_words(&(r[3]), a, n, b[3]);
        if (--n <= 0)
            return;
        bn_mul_add_words(&(r[4]), a, n, b[4]);
        r += 4;
        b += 4;
    }
}